

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O3

void Fxch_DivisorRemove(Fxch_Man_t *p,int Lit0,int Lit1,int Weight)

{
  uint uVar1;
  uint uVar2;
  Hash_IntMan_t *pHVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  float *pfVar6;
  Vec_Que_t *p_00;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  
  if (Lit0 == Lit1) {
    __assert_fail("Lit0 != Lit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x174,"void Fxch_DivisorRemove(Fxch_Man_t *, int, int, int)");
  }
  pHVar3 = p->vHash;
  pVVar4 = pHVar3->vTable;
  uVar8 = pVVar4->nSize;
  if (Lit0 < Lit1) {
    uVar7 = (ulong)(uint)(Lit1 * 0x1ec1 + Lit0 * 0x1051) % (ulong)uVar8;
    iVar9 = (int)uVar7;
    if ((iVar9 < 0) || ((int)uVar8 <= iVar9)) {
LAB_00359e04:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    uVar8 = pVVar4->pArray[uVar7];
    if (uVar8 != 0) {
      do {
        if ((int)uVar8 < 0) goto LAB_00359e04;
        uVar1 = uVar8 * 4;
        uVar2 = pHVar3->vObjs->nSize;
        if (uVar2 == uVar1 || SBORROW4(uVar2,uVar1) != (int)(uVar2 + uVar8 * -4) < 0)
        goto LAB_00359e04;
        piVar5 = pHVar3->vObjs->pArray;
        if ((piVar5[uVar1] == Lit0) && (piVar5[(ulong)uVar1 + 1] == Lit1)) goto LAB_00359dcd;
        uVar8 = piVar5[(ulong)uVar1 + 3];
      } while (uVar8 != 0);
    }
  }
  else {
    uVar7 = (ulong)(uint)(Lit0 * 0x1ec1 + Lit1 * 0x1051) % (ulong)uVar8;
    iVar9 = (int)uVar7;
    if ((iVar9 < 0) || ((int)uVar8 <= iVar9)) goto LAB_00359e04;
    uVar8 = pVVar4->pArray[uVar7];
    if (uVar8 != 0) {
      do {
        if ((int)uVar8 < 0) goto LAB_00359e04;
        uVar1 = uVar8 * 4;
        uVar2 = pHVar3->vObjs->nSize;
        if (uVar2 == uVar1 || SBORROW4(uVar2,uVar1) != (int)(uVar2 + uVar8 * -4) < 0)
        goto LAB_00359e04;
        piVar5 = pHVar3->vObjs->pArray;
        if ((piVar5[uVar1] == Lit1) && (piVar5[(ulong)uVar1 + 1] == Lit0)) goto LAB_00359dcd;
        uVar8 = piVar5[(ulong)uVar1 + 3];
      } while (uVar8 != 0);
    }
  }
  goto LAB_00359dae;
LAB_00359dcd:
  if ((int)uVar8 < (p->vWeights).nSize) {
    pfVar6 = (p->vWeights).pArray;
    pfVar6[uVar8] = (float)-Weight + pfVar6[uVar8];
    p_00 = p->vPrio;
    if (((int)uVar8 < p_00->nCap) && (-1 < p_00->pOrder[uVar8])) {
      Vec_QueUpdate(p_00,uVar8);
      return;
    }
    return;
  }
LAB_00359dae:
  __assert_fail("iDiv > 0 && iDiv < Vec_FltSize(&p->vWeights)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                ,0x179,"void Fxch_DivisorRemove(Fxch_Man_t *, int, int, int)");
}

Assistant:

void Fxch_DivisorRemove( Fxch_Man_t * p, int Lit0, int Lit1, int Weight )
{
    int iDiv;
    assert( Lit0 != Lit1 );
    if ( Lit0 < Lit1 )
        iDiv = *Hash_Int2ManLookup( p->vHash, Lit0, Lit1 );
    else
        iDiv = *Hash_Int2ManLookup( p->vHash, Lit1, Lit0 );
    assert( iDiv > 0 && iDiv < Vec_FltSize(&p->vWeights) );
    Vec_FltAddToEntry( &p->vWeights, iDiv, -Weight );
    if ( Vec_QueIsMember(p->vPrio, iDiv) )
        Vec_QueUpdate( p->vPrio, iDiv );
}